

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O0

void __thiscall cmExprParserHelper::~cmExprParserHelper(cmExprParserHelper *this)

{
  cmExprParserHelper *this_local;
  
  CleanupParser(this);
  std::__cxx11::string::~string((string *)&this->ErrorString);
  std::vector<char,_std::allocator<char>_>::~vector(&this->OutputBuffer);
  std::__cxx11::string::~string((string *)&this->InputBuffer);
  return;
}

Assistant:

cmExprParserHelper::~cmExprParserHelper()
{
  this->CleanupParser();
}